

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O1

void __thiscall
spvtools::opt::EliminateDeadMembersPass::MarkMembersAsLiveForCopyMemory
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  IRContext *pIVar1;
  uint32_t uVar2;
  Instruction *pIVar3;
  uint uVar4;
  
  uVar2 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar2 = (uint)inst->has_result_id_;
  }
  uVar2 = Instruction::GetSingleWordOperand(inst,uVar2);
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  pIVar3 = analysis::DefUseManager::GetDef
                     ((pIVar1->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,uVar2);
  uVar2 = 0;
  if (pIVar3->has_type_id_ == true) {
    uVar2 = Instruction::GetSingleWordOperand(pIVar3,0);
  }
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  pIVar3 = analysis::DefUseManager::GetDef
                     ((pIVar1->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,uVar2);
  uVar4 = (pIVar3->has_result_id_ & 1) + 1;
  if (pIVar3->has_type_id_ == false) {
    uVar4 = (uint)pIVar3->has_result_id_;
  }
  uVar2 = Instruction::GetSingleWordOperand(pIVar3,uVar4 + 1);
  MarkTypeAsFullyUsed(this,uVar2);
  return;
}

Assistant:

void EliminateDeadMembersPass::MarkMembersAsLiveForCopyMemory(
    const Instruction* inst) {
  uint32_t target_id = inst->GetSingleWordInOperand(0);
  Instruction* target_inst = get_def_use_mgr()->GetDef(target_id);
  uint32_t pointer_type_id = target_inst->type_id();
  Instruction* pointer_type_inst = get_def_use_mgr()->GetDef(pointer_type_id);
  uint32_t type_id = pointer_type_inst->GetSingleWordInOperand(1);
  MarkTypeAsFullyUsed(type_id);
}